

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ThreadSafeArena::SetInitialBlock
          (ThreadSafeArena *this,void *mem,size_t size)

{
  ThreadCache *pTVar1;
  SerialArena *this_00;
  void *in_RCX;
  Memory mem_00;
  SerialArena *serial;
  size_t size_local;
  void *mem_local;
  ThreadSafeArena *this_local;
  
  pTVar1 = thread_cache();
  mem_00.size = (size_t)pTVar1;
  mem_00.ptr = (void *)size;
  this_00 = SerialArena::New((SerialArena *)mem,mem_00,in_RCX);
  SerialArena::set_next(this_00,(SerialArena *)0x0);
  std::atomic<google::protobuf::internal::SerialArena_*>::store
            ((atomic<google::protobuf::internal::SerialArena_*> *)(this + 0x10),this_00,
             memory_order_relaxed);
  CacheSerialArena(this,this_00);
  return;
}

Assistant:

void ThreadSafeArena::SetInitialBlock(void* mem, size_t size) {
  SerialArena* serial = SerialArena::New({mem, size}, &thread_cache());
  serial->set_next(NULL);
  threads_.store(serial, std::memory_order_relaxed);
  CacheSerialArena(serial);
}